

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void * __thiscall controller::findHandle(controller *this,string *key)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  undefined1 **ppuVar4;
  char *pcVar5;
  string tmp;
  robj okey;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined4 local_38 [2];
  string *local_30;
  
  local_38[0] = 0;
  local_30 = key;
  piVar3 = (int *)dic::dictFetchValue(&this->dcdb,this->dictidx,local_38);
  if (piVar3 == (int *)0x0) {
    ppuVar4 = (undefined1 **)(undefined1 *)0x0;
  }
  else if (*piVar3 == 2) {
    local_50 = 0;
    local_48[0] = 0;
    pcVar5 = *(char **)(piVar3 + 2);
    local_58 = local_48;
    while (iVar2 = std::__cxx11::string::compare(pcVar5), iVar2 != 0) {
      pcVar5 = pcVar5 + 0x20;
      std::__cxx11::string::_M_append((char *)&local_58,**(ulong **)(piVar3 + 2));
    }
    ppuVar4 = &local_58;
    if (local_58 != local_48) {
      operator_delete(local_58);
      ppuVar4 = &local_58;
    }
  }
  else if (*piVar3 == 0) {
    ppuVar4 = (undefined1 **)*(undefined1 **)(piVar3 + 2);
  }
  else {
    lVar1 = *(long *)(piVar3 + 2);
    local_50 = 0;
    local_48[0] = 0;
    local_58 = local_48;
    for (; lVar1 != 0; lVar1 = *(long *)(lVar1 + 8)) {
      std::__cxx11::string::_M_append((char *)&local_58,**(ulong **)(lVar1 + 0x10));
    }
    ppuVar4 = &local_58;
    if (local_58 != local_48) {
      operator_delete(local_58);
      ppuVar4 = &local_58;
    }
  }
  return (undefined1 *)ppuVar4;
}

Assistant:

void * controller::findHandle(std::string key){
    robj okey;
    okey.objtype=_string;
    okey.ptr=&key;
    void *fetch=NULL;
    void *result=NULL;
    fetch=controller::dcdb.dictFetchValue(controller::dictidx,&okey);
    if(fetch==NULL)
        return fetch;
    else if(((robj *)fetch)->objtype==_string)
        return ((robj *)fetch)->ptr;//consider to return string 
    else if (((robj *)fetch)->objtype==_set){
        std::string tmp;
        std::string *p=((std::string *)(((robj *)fetch)->ptr));
        while(*p++!="\0"){
            tmp+=*((std::string *)(((robj *)fetch)->ptr));
        }
        result=&tmp;
        return result;
    }
    else if(((robj *)fetch)->objtype==_list){
        listNode *p=(listNode *)(((robj *)fetch)->ptr);
        std::string tmp;
        while(p!=NULL){
            tmp+=*((std::string *)p->value);
            p=p->next;  
        }
        result=&tmp;
        return result;
    }
}